

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O0

void __thiscall TestRunner::changeConsoleColor(TestRunner *this,ConsoleColors color)

{
  ConsoleColors color_local;
  TestRunner *this_local;
  
  if (color == White) {
    Logger::print<>("\x1b[1;0m");
  }
  else if (color == Red) {
    Logger::print<>("\x1b[1;31m");
  }
  else if (color == Green) {
    Logger::print<>("\x1b[1;32m");
  }
  return;
}

Assistant:

void TestRunner::changeConsoleColor(ConsoleColors color)
{
	switch (color)
	{
	case ConsoleColors::White:
		Logger::print("\033[1;0m");
		break;
	case ConsoleColors::Red:
		Logger::print("\033[1;31m");
		break;
	case ConsoleColors::Green:
		Logger::print("\033[1;32m");
		break;
	}
}